

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O1

void __thiscall
Json::BuiltStyledStreamWriter::writeCommentAfterValueOnSameLine
          (BuiltStyledStreamWriter *this,Value *root)

{
  _Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
  _Var1;
  ostream *poVar2;
  long lVar3;
  long *plVar4;
  ulong *puVar5;
  ulong *local_60;
  long local_58;
  ulong local_50;
  long lStack_48;
  undefined1 *local_40;
  undefined8 local_38;
  undefined1 local_30;
  undefined7 uStack_2f;
  
  if (this->cs_ != None) {
    _Var1._M_head_impl =
         (root->comments_).ptr_._M_t.
         super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
         ._M_t.
         super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
         .
         super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
         ._M_head_impl;
    if ((_Var1._M_head_impl !=
         (array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>
          *)0x0) && (*(size_type *)((long)(_Var1._M_head_impl)->_M_elems + 0x28) != 0)) {
      poVar2 = (this->super_StreamWriter).sout_;
      if (_Var1._M_head_impl ==
          (array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>
           *)0x0) {
        local_40 = &local_30;
        local_38 = 0;
        local_30 = 0;
      }
      else {
        local_40 = &local_30;
        lVar3 = *(long *)&((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          ((long)(_Var1._M_head_impl)->_M_elems + 0x20))->_M_dataplus;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_40,lVar3,
                   *(size_type *)((long)(_Var1._M_head_impl)->_M_elems + 0x28) + lVar3);
      }
      plVar4 = (long *)std::__cxx11::string::replace((ulong)&local_40,0,(char *)0x0,0x13c8dc);
      puVar5 = (ulong *)(plVar4 + 2);
      if ((ulong *)*plVar4 == puVar5) {
        local_50 = *puVar5;
        lStack_48 = plVar4[3];
        local_60 = &local_50;
      }
      else {
        local_50 = *puVar5;
        local_60 = (ulong *)*plVar4;
      }
      local_58 = plVar4[1];
      *plVar4 = (long)puVar5;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,(char *)local_60,local_58);
      if (local_60 != &local_50) {
        operator_delete(local_60,local_50 + 1);
      }
      if (local_40 != &local_30) {
        operator_delete(local_40,CONCAT71(uStack_2f,local_30) + 1);
      }
    }
    _Var1._M_head_impl =
         (root->comments_).ptr_._M_t.
         super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
         ._M_t.
         super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
         .
         super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
         ._M_head_impl;
    if ((_Var1._M_head_impl !=
         (array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>
          *)0x0) && (*(size_type *)((long)(_Var1._M_head_impl)->_M_elems + 0x48) != 0)) {
      writeIndent(this);
      poVar2 = (this->super_StreamWriter).sout_;
      _Var1._M_head_impl =
           (root->comments_).ptr_._M_t.
           super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
           .
           super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
           ._M_head_impl;
      if (_Var1._M_head_impl ==
          (array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>
           *)0x0) {
        local_60 = &local_50;
        local_58 = 0;
        local_50 = local_50 & 0xffffffffffffff00;
      }
      else {
        local_60 = &local_50;
        lVar3 = *(long *)&((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          ((long)(_Var1._M_head_impl)->_M_elems + 0x40))->_M_dataplus;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_60,lVar3,
                   *(size_type *)((long)(_Var1._M_head_impl)->_M_elems + 0x48) + lVar3);
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,(char *)local_60,local_58);
      if (local_60 != &local_50) {
        operator_delete(local_60,local_50 + 1);
      }
    }
  }
  return;
}

Assistant:

void BuiltStyledStreamWriter::writeCommentAfterValueOnSameLine(
    Value const& root) {
  if (cs_ == CommentStyle::None)
    return;
  if (root.hasComment(commentAfterOnSameLine))
    *sout_ << " " + root.getComment(commentAfterOnSameLine);

  if (root.hasComment(commentAfter)) {
    writeIndent();
    *sout_ << root.getComment(commentAfter);
  }
}